

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O3

int32_t ulocimp_getLanguage_63(char *localeID,char *language,int32_t languageCapacity,char **pEnd)

{
  byte c;
  char *pcVar1;
  char **ppcVar2;
  char cVar3;
  ushort uVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  char lang [4];
  char local_3c [4];
  char **local_38;
  
  local_3c[0] = '\0';
  local_3c[1] = '\0';
  local_3c[2] = '\0';
  local_3c[3] = '\0';
  uVar7 = 0;
  uVar6 = (byte)*localeID - 0x49;
  local_38 = pEnd;
  if ((uVar6 < 0x30) && ((0x800100008001U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) {
    if ((localeID[1] == '_') || (localeID[1] == '-')) {
      if (0 < languageCapacity) {
        cVar3 = uprv_asciitolower_63(*localeID);
        *language = cVar3;
        language[1] = '-';
      }
      localeID = localeID + 2;
      uVar7 = 2;
    }
    else {
      uVar7 = 0;
    }
  }
  while( true ) {
    c = *localeID;
    if (((c - 0x2d < 0x33) && ((0x4000000080003U >> ((ulong)(c - 0x2d) & 0x3f) & 1) != 0)) ||
       (c == 0)) break;
    if ((long)uVar7 < (long)languageCapacity) {
      cVar3 = uprv_asciitolower_63(c);
      language[uVar7] = cVar3;
    }
    if (uVar7 < 3) {
      cVar3 = uprv_asciitolower_63(*localeID);
      local_3c[uVar7] = cVar3;
    }
    uVar7 = uVar7 + 1;
    localeID = (char *)((byte *)localeID + 1);
  }
  if (uVar7 == 3) {
    uVar4 = _findIndex(LANGUAGES_3,local_3c);
    ppcVar2 = local_38;
    if ((short)uVar4 < 0) {
      uVar7 = 3;
      local_38 = ppcVar2;
    }
    else {
      pcVar1 = LANGUAGES[uVar4];
      cVar3 = *pcVar1;
      pcVar9 = pcVar1;
      if (cVar3 != '\0') {
        lVar8 = 0;
        do {
          if (languageCapacity < 1) {
            sVar5 = strlen(pcVar1 + lVar8);
            uVar7 = lVar8 + sVar5;
            local_38 = ppcVar2;
            goto LAB_002b7ed0;
          }
          language[lVar8] = cVar3;
          languageCapacity = languageCapacity + -1;
          cVar3 = pcVar1[lVar8 + 1];
          lVar8 = lVar8 + 1;
        } while (cVar3 != '\0');
        pcVar9 = pcVar1 + lVar8;
      }
      uVar7 = (long)pcVar9 - (long)pcVar1;
      local_38 = ppcVar2;
    }
  }
LAB_002b7ed0:
  if (local_38 != (char **)0x0) {
    *local_38 = localeID;
  }
  return (int32_t)uVar7;
}

Assistant:

U_CFUNC int32_t
ulocimp_getLanguage(const char *localeID,
                    char *language, int32_t languageCapacity,
                    const char **pEnd) {
    int32_t i=0;
    int32_t offset;
    char lang[4]={ 0, 0, 0, 0 }; /* temporary buffer to hold language code for searching */

    /* if it starts with i- or x- then copy that prefix */
    if(_isIDPrefix(localeID)) {
        if(i<languageCapacity) {
            language[i]=(char)uprv_tolower(*localeID);
        }
        if(i<languageCapacity) {
            language[i+1]='-';
        }
        i+=2;
        localeID+=2;
    }

    /* copy the language as far as possible and count its length */
    while(!_isTerminator(*localeID) && !_isIDSeparator(*localeID)) {
        if(i<languageCapacity) {
            language[i]=(char)uprv_tolower(*localeID);
        }
        if(i<3) {
            U_ASSERT(i>=0);
            lang[i]=(char)uprv_tolower(*localeID);
        }
        i++;
        localeID++;
    }

    if(i==3) {
        /* convert 3 character code to 2 character code if possible *CWB*/
        offset=_findIndex(LANGUAGES_3, lang);
        if(offset>=0) {
            i=_copyCount(language, languageCapacity, LANGUAGES[offset]);
        }
    }

    if(pEnd!=NULL) {
        *pEnd=localeID;
    }
    return i;
}